

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

ByteArray *
ot::commissioner::CommissionerImpl::GetActiveOperationalDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((short)aDatasetFlags < 0) {
    EncodeTlvType(__return_storage_ptr__,kActiveTimestamp);
  }
  if ((aDatasetFlags >> 0xe & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kChannel);
  }
  if ((aDatasetFlags >> 0xd & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kChannelMask);
  }
  if ((aDatasetFlags >> 0xc & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kExtendedPanId);
  }
  if ((aDatasetFlags >> 0xb & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagNetworkData);
  }
  if ((aDatasetFlags >> 10 & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagRoute64);
  }
  if ((aDatasetFlags >> 9 & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagTimeout);
  }
  if ((aDatasetFlags >> 8 & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagMacAddress);
  }
  if ((char)aDatasetFlags < '\0') {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagConnectivity);
  }
  if ((aDatasetFlags & 0x40) != 0) {
    EncodeTlvType(__return_storage_ptr__,kSecurityPolicy);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetActiveOperationalDatasetTlvs(uint16_t aDatasetFlags)
{
    ByteArray tlvTypes;

    if (aDatasetFlags & ActiveOperationalDataset::kActiveTimestampBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kActiveTimestamp);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kChannelBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kChannel);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kChannelMaskBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kChannelMask);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kExtendedPanIdBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kExtendedPanId);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kMeshLocalPrefixBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkMeshLocalPrefix);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kNetworkMasterKeyBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkMasterKey);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kNetworkNameBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkName);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kPanIdBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kPanId);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kPSKcBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kPSKc);
    }
    if (aDatasetFlags & ActiveOperationalDataset::kSecurityPolicyBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kSecurityPolicy);
    }

    return tlvTypes;
}